

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *__return_storage_ptr__,text *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  size_type sVar5;
  _Alloc_hider _Var6;
  size_type sVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_type *psVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  undefined8 local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  
  lVar2 = std::__cxx11::string::rfind((char)arg,0x3d);
  if (lVar2 == -1) {
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_allocated_capacity =
         local_e0.field_2._M_allocated_capacity & 0xffffffffffffff00;
    std::make_pair<std::__cxx11::string&,std::__cxx11::string>(&local_60,arg,&local_e0);
    sVar5 = local_60.first._M_string_length;
    paVar4 = &local_60.first.field_2;
    _Var3._M_p = local_60.first._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p == paVar4) {
      local_110._8_8_ = local_60.first.field_2._8_8_;
      _Var3._M_p = (pointer)&local_110;
    }
    local_110._M_allocated_capacity = local_60.first.field_2._M_allocated_capacity;
    paVar8 = &local_60.second.field_2;
    local_60.first._M_string_length = 0;
    local_60.first.field_2._M_allocated_capacity =
         local_60.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
    _Var6._M_p = local_60.second._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.second._M_dataplus._M_p == paVar8) {
      local_f0._8_8_ = local_60.second.field_2._8_8_;
      _Var6._M_p = (pointer)&local_f0;
    }
    local_f0._M_allocated_capacity = local_60.second.field_2._M_allocated_capacity;
    psVar9 = &local_60.second._M_string_length;
    sVar7 = local_60.second._M_string_length;
    local_60.first._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_a0,(ulong)arg);
    std::__cxx11::string::substr((ulong)&local_80,(ulong)arg);
    local_b8 = local_78;
    sVar5 = local_98;
    paVar4 = &local_60.first.field_2;
    _Var3._M_p = (pointer)local_a0;
    if (local_a0 == &local_90) {
      local_60.first.field_2._8_8_ = local_90._8_8_;
      _Var3._M_p = (pointer)paVar4;
    }
    local_60.first.field_2._M_allocated_capacity._1_7_ = local_90._M_allocated_capacity._1_7_;
    local_60.first.field_2._M_local_buf[0] = local_90._M_local_buf[0];
    local_a0 = &local_90;
    local_98 = 0;
    local_90._M_local_buf[0] = '\0';
    paVar1 = &local_60.second.field_2;
    if (local_80 == &local_70) {
      local_60.second.field_2._8_8_ = local_70._8_8_;
      local_80 = paVar1;
    }
    local_60.second.field_2._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_;
    local_60.second.field_2._M_local_buf[0] = local_70._M_local_buf[0];
    local_78 = 0;
    local_70._M_local_buf[0] = '\0';
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p == paVar4) {
      local_e0.field_2._8_8_ = local_60.first.field_2._8_8_;
      _Var3._M_p = local_e0._M_dataplus._M_p;
    }
    paVar8 = &local_b0;
    if (local_80 == paVar1) {
      local_b0._8_8_ = local_60.second.field_2._8_8_;
      _Var6._M_p = (pointer)paVar8;
    }
    else {
      local_c0 = local_80;
      _Var6._M_p = (pointer)local_80;
    }
    if (_Var3._M_p == local_e0._M_dataplus._M_p) {
      _Var3._M_p = (pointer)&local_110;
      local_110._8_8_ = local_e0.field_2._8_8_;
    }
    local_110._M_allocated_capacity = local_60.first.field_2._M_allocated_capacity;
    local_e0._M_string_length = 0;
    local_e0.field_2._M_allocated_capacity = (ulong)(uint7)local_90._M_allocated_capacity._1_7_ << 8
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var6._M_p == paVar8) {
      _Var6._M_p = (pointer)&local_f0;
      local_f0._8_8_ = local_b0._8_8_;
    }
    local_f0._M_allocated_capacity = local_60.second.field_2._M_allocated_capacity;
    psVar9 = &local_b8;
    sVar7 = local_b8;
    local_80 = &local_70;
  }
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(psVar9 + -1))->_M_dataplus
  )._M_p = (pointer)paVar8;
  *psVar9 = 0;
  paVar8->_M_local_buf[0] = '\0';
  paVar4 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p == &local_110) {
    paVar4->_M_allocated_capacity = local_110._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_110._8_8_;
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p = _Var3._M_p;
    (__return_storage_ptr__->first).field_2._M_allocated_capacity = local_110._M_allocated_capacity;
  }
  (__return_storage_ptr__->first)._M_string_length = sVar5;
  local_100 = &local_f0;
  local_110._M_allocated_capacity = local_110._M_allocated_capacity & 0xffffffffffffff00;
  paVar4 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var6._M_p == local_100) {
    paVar4->_M_allocated_capacity = local_f0._M_allocated_capacity;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_f0._8_8_;
  }
  else {
    (__return_storage_ptr__->second)._M_dataplus._M_p = _Var6._M_p;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity = local_f0._M_allocated_capacity;
  }
  (__return_storage_ptr__->second)._M_string_length = sVar7;
  local_f8 = 0;
  local_f0._M_allocated_capacity = local_f0._M_allocated_capacity & 0xffffffffffffff00;
  if (lVar2 == -1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.second._M_dataplus._M_p != &local_60.second.field_2) {
      operator_delete(local_60.second._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
      operator_delete(local_60.first._M_dataplus._M_p);
    }
    paVar4 = &local_e0.field_2;
  }
  else {
    if (local_c0 != &local_b0) {
      operator_delete(local_c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80);
    }
    paVar4 = &local_90;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(&paVar4->_M_allocated_capacity)[-2] != paVar4) {
    operator_delete((undefined1 *)(&paVar4->_M_allocated_capacity)[-2]);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<text, text>
split_option( text arg )
{
    text::size_type pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_pair( arg, text() )
                : std::make_pair( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}